

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  Expr **ppWhere;
  undefined1 *puVar2;
  u8 uVar3;
  i16 iVar4;
  Parse *pParse;
  sqlite3 *db;
  ExprList *pList;
  SrcList *pList_00;
  Parse *pParse_00;
  sqlite3 *db_00;
  With *pWVar5;
  SrcList *pSVar6;
  Schema *pSVar7;
  Column *pCVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  Table *pTVar13;
  char *pcVar14;
  Select *pSVar15;
  Select *pSVar16;
  Table **ppTVar17;
  SrcList_item *pSVar18;
  char *__s;
  Expr *pEVar19;
  Expr *pEVar20;
  size_t sVar21;
  char *pcVar22;
  ulong uVar23;
  ExprList *pEVar24;
  long lVar25;
  ExprList_item *pEVar26;
  Schema **ppSVar27;
  With *p_1;
  With *pWVar28;
  Select *pSVar29;
  Table **ppTVar30;
  Select *pSVar31;
  With *pEList;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  SrcList *pSVar35;
  long lVar36;
  long lVar37;
  int i;
  byte *pbVar38;
  int i_1;
  uint iLeft;
  long lVar39;
  char *p_00;
  bool bVar40;
  bool bVar41;
  char *local_f0;
  Select *local_e8;
  With *local_d8;
  sqlite3 *local_b0;
  ulong local_a8;
  long local_a0;
  Select *local_90;
  ulong local_60;
  Token sColname;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar34 = p->selFlags;
  p->selFlags = uVar34 | 0x40;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  if ((uVar34 & 0x40) != 0) {
    return 1;
  }
  pList = p->pEList;
  pList_00 = p->pSrc;
  pWVar28 = p->pWith;
  if (pWVar28 != (With *)0x0) {
    pWVar28->pOuter = pParse->pWith;
    pParse->pWith = pWVar28;
  }
  sqlite3SrcListAssignCursors(pParse,pList_00);
  if (0 < pList_00->nSrc) {
    uVar34 = 0;
    pSVar18 = pList_00->a;
    do {
      bVar9 = (pSVar18->fg).field_0x1;
      uVar10 = 0;
      if ((bVar9 & 0x20) == 0) {
        pParse_00 = pWalker->pParse;
        db_00 = pParse_00->db;
        if ((pSVar18->zDatabase == (char *)0x0) &&
           (pcVar14 = pSVar18->zName, pcVar14 != (char *)0x0)) {
          local_a8 = (ulong)uVar34;
          pWVar28 = pParse_00->pWith;
          bVar41 = pWVar28 == (With *)0x0;
          local_b0 = db_00;
          if (bVar41) {
            pSVar16 = (Select *)0x0;
          }
          else {
            do {
              uVar33 = (ulong)pWVar28->nCte;
              bVar40 = 0 < (long)uVar33;
              if (0 < (long)uVar33) {
                iVar11 = sqlite3StrICmp(pcVar14,pWVar28->a[0].zName);
                if (iVar11 == 0) {
                  local_e8 = (Select *)pWVar28->a;
                  bVar40 = true;
                  local_d8 = pWVar28;
                }
                else {
                  uVar32 = 1;
                  pSVar16 = (Select *)(pWVar28 + 1);
                  do {
                    pSVar31 = pSVar16;
                    uVar23 = uVar32;
                    pSVar15 = local_e8;
                    pWVar5 = local_d8;
                    if (uVar33 == uVar23) break;
                    iVar11 = sqlite3StrICmp(pcVar14,(char *)pSVar31->pEList);
                    uVar32 = uVar23 + 1;
                    pSVar16 = (Select *)(pSVar31->addrOpenEphm + 1);
                    pSVar15 = pSVar31;
                    pWVar5 = pWVar28;
                  } while (iVar11 != 0);
                  local_d8 = pWVar5;
                  local_e8 = pSVar15;
                  bVar40 = uVar23 < uVar33;
                }
              }
              if (bVar40) break;
              pWVar28 = pWVar28->pOuter;
              bVar41 = pWVar28 == (With *)0x0;
            } while (!bVar41);
            pSVar16 = local_e8;
            if (bVar41) {
              pSVar16 = (Select *)0x0;
            }
          }
        }
        else {
          pSVar16 = (Select *)0x0;
        }
        if (pSVar16 == (Select *)0x0) {
LAB_0017abd6:
          if (pSVar18->pTab == (Table *)0x0) {
            if (pSVar18->zName == (char *)0x0) {
              iVar11 = sqlite3WalkSelect(pWalker,pSVar18->pSelect);
              uVar10 = 1;
              if ((iVar11 == 0) && (iVar11 = sqlite3ExpandSubquery(pParse,pSVar18), iVar11 == 0))
              goto LAB_0017abdd;
            }
            else {
              pTVar13 = sqlite3LocateTableItem(pParse,0,pSVar18);
              pSVar18->pTab = pTVar13;
              uVar10 = 1;
              if (pTVar13 != (Table *)0x0) {
                if (pTVar13->nTabRef < 0xffff) {
                  pTVar13->nTabRef = pTVar13->nTabRef + 1;
                  if ((pTVar13->nModuleArg != 0) || (((pSVar18->fg).field_0x1 & 4) == 0)) {
                    if ((pTVar13->nModuleArg != 0) || (pTVar13->pSelect != (Select *)0x0)) {
                      iVar11 = sqlite3ViewGetColumnNames(pParse,pTVar13);
                      if (iVar11 != 0) goto LAB_0017abed;
                      pSVar16 = sqlite3SelectDup(db,pTVar13->pSelect,0);
                      pSVar18->pSelect = pSVar16;
                      iVar4 = pTVar13->nCol;
                      pTVar13->nCol = -1;
                      sqlite3WalkSelect(pWalker,pSVar16);
                      pTVar13->nCol = iVar4;
                    }
                    goto LAB_0017abdd;
                  }
                  sqlite3ErrorMsg(pParse,"\'%s\' is not a function",pSVar18->zName);
                }
                else {
                  sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar13->zName);
                  pSVar18->pTab = (Table *)0x0;
                }
              }
            }
          }
          else {
LAB_0017abdd:
            uVar10 = sqlite3IndexedByLookup(pParse,pSVar18);
          }
        }
        else {
          pcVar14 = *(char **)&pSVar16->selId;
          if ((ExprList *)pcVar14 == (ExprList *)0x0) {
            if ((bVar9 & 4) == 0) {
              pTVar13 = (Table *)sqlite3DbMallocZero(db_00,0x80);
              pSVar18->pTab = pTVar13;
              uVar10 = 1;
              if (pTVar13 != (Table *)0x0) {
                pTVar13->nTabRef = 1;
                pcVar14 = sqlite3DbStrDup(db_00,(char *)pSVar16->pEList);
                pTVar13->zName = pcVar14;
                pTVar13->iPKey = -1;
                pTVar13->nRowLogEst = 200;
                *(byte *)&pTVar13->tabFlags = (byte)pTVar13->tabFlags | 0x42;
                pSVar15 = sqlite3SelectDup(db_00,(Select *)((Cte *)&pSVar16->iLimit)->zName,0);
                pSVar18->pSelect = pSVar15;
                if (db_00->mallocFailed == '\0') {
                  bVar9 = pSVar15->op + 0x81;
                  local_a8 = CONCAT71(local_a8._1_7_,bVar9);
                  if ((bVar9 < 2) && (pSVar6 = pSVar15->pSrc, 0 < pSVar6->nSrc)) {
                    pbVar38 = &pSVar6->a[0].fg.field_0x1;
                    lVar25 = 0;
                    do {
                      if (((*(long *)(pbVar38 + -0x35) == 0) &&
                          (*(char **)(pbVar38 + -0x2d) != (char *)0x0)) &&
                         (iVar11 = sqlite3StrICmp(*(char **)(pbVar38 + -0x2d),
                                                  (char *)pSVar16->pEList), iVar11 == 0)) {
                        *(Table **)(pbVar38 + -0x1d) = pTVar13;
                        *pbVar38 = *pbVar38 | 0x20;
                        pTVar13->nTabRef = pTVar13->nTabRef + 1;
                        pbVar1 = (byte *)((long)&pSVar15->selFlags + 1);
                        *pbVar1 = *pbVar1 | 0x20;
                      }
                      lVar25 = lVar25 + 1;
                      pbVar38 = pbVar38 + 0x70;
                    } while (lVar25 < pSVar6->nSrc);
                  }
                  local_e8 = pSVar15;
                  if (pTVar13->nTabRef < 3) {
                    *(char **)&pSVar16->selId = "circular reference: %s";
                    local_b0 = (sqlite3 *)pParse_00->pWith;
                    pParse_00->pWith = local_d8;
                    if (bVar9 < 2) {
                      local_90 = pSVar15->pPrior;
                      local_90->pWith = pSVar15->pWith;
                      sqlite3WalkSelect(pWalker,local_90);
                      local_90->pWith = (With *)0x0;
                    }
                    else {
                      sqlite3WalkSelect(pWalker,pSVar15);
                    }
                    pParse_00->pWith = local_d8;
                    pSVar31 = pSVar15;
                    do {
                      pSVar29 = pSVar31;
                      pSVar31 = pSVar29->pPrior;
                    } while (pSVar31 != (Select *)0x0);
                    pWVar28 = (With *)pSVar29->pEList;
                    pWVar5 = *(With **)&pSVar16->op;
                    pEList = pWVar28;
                    if (((pWVar5 == (With *)0x0) || (pEList = pWVar5, pWVar28 == (With *)0x0)) ||
                       (pWVar28->nCte == pWVar5->nCte)) {
                      sqlite3ColumnsFromExprList
                                (pParse_00,(ExprList *)pEList,&pTVar13->nCol,&pTVar13->aCol);
                      if (bVar9 < 2) {
                        pcVar14 = "multiple recursive references: %s";
                        if ((pSVar15->selFlags >> 0xd & 1) == 0) {
                          pcVar14 = "recursive reference in a subquery: %s";
                        }
                        *(char **)&pSVar16->selId = pcVar14;
                        sqlite3WalkSelect(pWalker,pSVar15);
                      }
                      *(ExprList **)&pSVar16->selId = (ExprList *)0x0;
                      pParse_00->pWith = (With *)local_b0;
                      goto LAB_0017abd6;
                    }
                    sqlite3ErrorMsg(pParse_00,"table %s has %d values for %d columns",
                                    pSVar16->pEList);
                    pParse_00->pWith = (With *)local_b0;
                  }
                  else {
                    sqlite3ErrorMsg(pParse_00,"multiple references to recursive table: %s",
                                    pSVar16->pEList);
                  }
                }
              }
              goto LAB_0017abed;
            }
            pEVar24 = (ExprList *)pSVar18->zName;
            pcVar14 = "\'%s\' is not a function";
          }
          else {
            pEVar24 = pSVar16->pEList;
          }
          sqlite3ErrorMsg(pParse_00,pcVar14,pEVar24);
          uVar10 = 1;
        }
      }
LAB_0017abed:
      if ((uVar10 & 0xfffffffb) != 0) {
        return 2;
      }
      uVar34 = uVar34 + 1;
      pSVar18 = pSVar18 + 1;
    } while ((int)uVar34 < pList_00->nSrc);
  }
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pSVar6 = p->pSrc;
  if (1 < pSVar6->nSrc) {
    pSVar18 = pSVar6->a;
    pSVar35 = pSVar6 + 1;
    ppWhere = &p->pWhere;
    ppTVar17 = &pSVar6->a[0].pTab;
    lVar25 = 0;
    do {
      pTVar13 = (Table *)pSVar35->a[0].zAlias;
      bVar41 = false;
      if (pTVar13 != (Table *)0x0 && pSVar18->pTab != (Table *)0x0) {
        bVar9 = (byte)pSVar35->a[0].regReturn;
        uVar34 = (bVar9 & 0x20) >> 5;
        if ((bVar9 & 4) != 0) {
          if ((*(long *)&pSVar35->a[0].iCursor != 0) || (pSVar35->a[0].pOn != (Expr *)0x0)) {
            sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
            bVar41 = true;
            goto LAB_0017af8f;
          }
          if (0 < pTVar13->nCol) {
            lVar37 = 0;
            do {
              pcVar14 = pTVar13->aCol[lVar37].zName;
              uVar33 = 0;
              ppTVar30 = ppTVar17;
              do {
                uVar10 = columnIndex(*ppTVar30,pcVar14);
                if (-1 < (int)uVar10) {
                  local_60 = uVar33 & 0xffffffff;
                  local_90 = (Select *)(ulong)uVar10;
                  break;
                }
                uVar33 = uVar33 + 1;
                ppTVar30 = ppTVar30 + 0xe;
              } while (lVar25 + 1U != uVar33);
              if (-1 < (int)uVar10) {
                addWhereTerm(pParse,pSVar6,(int)local_60,(int)local_90,(int)lVar25 + 1,(int)lVar37,
                             uVar34,ppWhere);
              }
              lVar37 = lVar37 + 1;
            } while (lVar37 < pTVar13->nCol);
          }
        }
        pEVar19 = *(Expr **)&pSVar35->a[0].iCursor;
        if (pEVar19 != (Expr *)0x0) {
          if (pSVar35->a[0].pOn != (Expr *)0x0) {
            sqlite3ErrorMsg(pParse,"cannot have both ON and USING clauses in the same join");
            bVar41 = true;
            goto LAB_0017af8f;
          }
          if ((bVar9 & 0x20) != 0) {
            setJoinExpr(pEVar19,pSVar35->a[0].regResult);
          }
          pEVar19 = sqlite3ExprAnd(pParse->db,*ppWhere,*(Expr **)&pSVar35->a[0].iCursor);
          *ppWhere = pEVar19;
          *(undefined8 *)&pSVar35->a[0].iCursor = 0;
        }
        pEVar19 = pSVar35->a[0].pOn;
        bVar41 = false;
        if ((pEVar19 != (Expr *)0x0) && (0 < (pEVar19->u).iValue)) {
          lVar37 = 0;
          do {
            pcVar14 = *(char **)(*(long *)pEVar19 + lVar37 * 0x10);
            iVar11 = columnIndex(pTVar13,pcVar14);
            if (iVar11 < 0) {
LAB_0017af62:
              sqlite3ErrorMsg(pParse,
                              "cannot join using column %s - column not present in both tables",
                              pcVar14);
              bVar41 = true;
              goto LAB_0017af8f;
            }
            lVar36 = 0;
            ppTVar30 = ppTVar17;
            do {
              uVar10 = columnIndex(*ppTVar30,pcVar14);
              if (-1 < (int)uVar10) {
                iLeft = (uint)lVar36;
                uVar12 = uVar10;
                goto LAB_0017aef9;
              }
              lVar36 = lVar36 + 1;
              ppTVar30 = ppTVar30 + 0xe;
            } while (lVar25 + 1 != lVar36);
            iLeft = (uint)local_b0;
            uVar12 = (uint)local_a8;
LAB_0017aef9:
            local_a8 = (ulong)uVar12;
            local_b0 = (sqlite3 *)(ulong)iLeft;
            if ((int)uVar10 < 0) goto LAB_0017af62;
            addWhereTerm(pParse,pSVar6,iLeft,uVar12,(int)lVar25 + 1,iVar11,uVar34,ppWhere);
            lVar37 = lVar37 + 1;
          } while (lVar37 < (pEVar19->u).iValue);
          bVar41 = false;
        }
      }
LAB_0017af8f:
      if (bVar41) {
        return 2;
      }
      lVar25 = lVar25 + 1;
      pSVar35 = (SrcList *)&pSVar35->a[0].pIBIndex;
      pSVar18 = pSVar18 + 1;
    } while (lVar25 < (long)pSVar6->nSrc + -1);
  }
  uVar33 = (ulong)pList->nExpr;
  uVar34 = 0;
  bVar41 = 0 < (long)uVar33;
  if (0 < (long)uVar33) {
    pEVar26 = pList->a;
    uVar34 = 0;
    uVar32 = 1;
    do {
      pEVar19 = pEVar26->pExpr;
      uVar3 = pEVar19->op;
      if (uVar3 == 0x86) {
        uVar3 = pEVar19->pRight->op;
      }
      if (uVar3 == 0xac) {
        if (bVar41) {
          if (0 < pList->nExpr) {
            uVar10 = (uint)pParse->db->flags & 0x44;
            lVar25 = 0;
            local_d8 = (With *)0x0;
            goto LAB_0017b134;
          }
          local_d8 = (With *)0x0;
          goto LAB_0017b63a;
        }
        break;
      }
      uVar34 = uVar34 | pEVar19->flags;
      bVar41 = uVar32 < uVar33;
      pEVar26 = pEVar26 + 1;
      bVar40 = uVar32 != uVar33;
      uVar32 = uVar32 + 1;
    } while (bVar40);
  }
  goto LAB_0017b656;
LAB_0017b134:
  do {
    pEVar19 = pList->a[lVar25].pExpr;
    uVar34 = uVar34 | pEVar19->flags;
    if (pEVar19->op == 0xac) {
      pcVar14 = (char *)0x0;
LAB_0017b1bc:
      if (pList_00->nSrc < 1) {
        bVar41 = true;
      }
      else {
        lVar37 = 0;
        local_a0 = -0x70;
        bVar41 = false;
        pSVar18 = pList_00->a;
        do {
          local_f0 = pSVar18->zAlias;
          pTVar13 = pSVar18->pTab;
          if (local_f0 == (char *)0x0) {
            local_f0 = pTVar13->zName;
          }
          uVar3 = db->mallocFailed;
          if (uVar3 == '\0') {
            pSVar16 = pSVar18->pSelect;
            if ((pSVar16 == (Select *)0x0) || ((pSVar16->selFlags & 0x800) == 0)) {
              if ((pcVar14 != (char *)0x0) &&
                 (iVar11 = sqlite3StrICmp(pcVar14,local_f0), iVar11 != 0)) goto LAB_0017b58b;
              if (pTVar13->pSchema == (Schema *)0x0) {
                uVar12 = 0xfff0bdc0;
              }
              else {
                uVar12 = 0xffffffff;
                ppSVar27 = &db->aDb->pSchema;
                do {
                  uVar12 = uVar12 + 1;
                  pSVar7 = *ppSVar27;
                  ppSVar27 = ppSVar27 + 4;
                } while (pSVar7 != pTVar13->pSchema);
              }
              if ((int)uVar12 < 0) {
                pSVar16 = (Select *)0x0;
                __s = "*";
              }
              else {
                __s = db->aDb[uVar12].zDbSName;
                pSVar16 = (Select *)0x0;
              }
            }
            else {
              __s = (char *)0x0;
            }
            if (0 < pTVar13->nCol) {
              lVar36 = 0;
              do {
                pCVar8 = pTVar13->aCol;
                pcVar22 = pCVar8[lVar36].zName;
                if (((pSVar16 == (Select *)0x0 || pcVar14 == (char *)0x0) ||
                    (iVar11 = sqlite3MatchSpanName
                                        (pSVar16->pEList->a[lVar36].zSpan,(char *)0x0,pcVar14,
                                         (char *)0x0), iVar11 != 0)) &&
                   (((p->selFlags & 0x20000) != 0 || ((pCVar8[lVar36].colFlags & 2) == 0)))) {
                  if (lVar37 != 0 && pcVar14 == (char *)0x0) {
                    if (((pSVar18->fg).jointype & 4) != 0) {
                      lVar39 = 0;
                      do {
                        iVar11 = columnIndex(*(Table **)((long)&pList_00->a[0].pTab + lVar39),
                                             pcVar22);
                        if (-1 < iVar11) break;
                        bVar41 = local_a0 != lVar39;
                        lVar39 = lVar39 + 0x70;
                      } while (bVar41);
                      bVar41 = true;
                      if (-1 < iVar11) goto LAB_0017b575;
                    }
                    iVar11 = sqlite3IdListIndex(pSVar18->pUsing,pcVar22);
                    bVar41 = true;
                    if (-1 < iVar11) goto LAB_0017b575;
                  }
                  pEVar19 = sqlite3Expr(db,0x3b,pcVar22);
                  if ((uVar10 == 4) || (1 < pList_00->nSrc)) {
                    pEVar20 = sqlite3Expr(db,0x3b,local_f0);
                    pEVar19 = sqlite3PExpr(pParse,0x86,pEVar20,pEVar19);
                    if (__s != (char *)0x0) {
                      sColname.z = __s;
                      sVar21 = strlen(__s);
                      sColname.n = (uint)sVar21 & 0x3fffffff;
                      pEVar20 = sqlite3ExprAlloc(db,0x3b,&sColname,0);
                      pEVar19 = sqlite3PExpr(pParse,0x86,pEVar20,pEVar19);
                    }
                    if (uVar10 != 4) goto LAB_0017b49b;
                    pcVar22 = sqlite3MPrintf(db,"%s.%s",local_f0);
                    p_00 = pcVar22;
                  }
                  else {
LAB_0017b49b:
                    p_00 = (char *)0x0;
                  }
                  local_d8 = (With *)sqlite3ExprListAppend(pParse,(ExprList *)local_d8,pEVar19);
                  sColname.z = pcVar22;
                  if (pcVar22 == (char *)0x0) {
                    sColname.n = 0;
                  }
                  else {
                    sVar21 = strlen(pcVar22);
                    sColname.n = (uint)sVar21 & 0x3fffffff;
                  }
                  sqlite3ExprListSetName(pParse,(ExprList *)local_d8,&sColname,0);
                  if ((local_d8 != (With *)0x0) && ((p->selFlags & 0x800) != 0)) {
                    iVar11 = ((ExprList *)local_d8)->nExpr;
                    if (pSVar16 == (Select *)0x0) {
                      pcVar22 = sqlite3MPrintf(db,"%s.%s.%s",__s,local_f0,pcVar22);
                    }
                    else {
                      pcVar22 = sqlite3DbStrDup(db,pSVar16->pEList->a[lVar36].zSpan);
                    }
                    ((ExprList *)local_d8)->a[(long)iVar11 + -1].zSpan = pcVar22;
                    puVar2 = &((ExprList *)local_d8)->a[(long)iVar11 + -1].field_0x19;
                    *puVar2 = *puVar2 | 2;
                  }
                  bVar41 = true;
                  if (p_00 != (char *)0x0) {
                    sqlite3DbFreeNN(db,p_00);
                  }
                }
LAB_0017b575:
                lVar36 = lVar36 + 1;
              } while (lVar36 < pTVar13->nCol);
            }
          }
LAB_0017b58b:
          if (uVar3 != '\0') break;
          lVar37 = lVar37 + 1;
          pSVar18 = pSVar18 + 1;
          local_a0 = local_a0 + 0x70;
        } while (lVar37 < pList_00->nSrc);
        bVar41 = !bVar41;
      }
      if (bVar41) {
        if (pcVar14 == (char *)0x0) {
          sqlite3ErrorMsg(pParse,"no tables specified");
        }
        else {
          sqlite3ErrorMsg(pParse,"no such table: %s");
        }
      }
    }
    else {
      if ((pEVar19->op == 0x86) && (pEVar19->pRight->op == 0xac)) {
        pcVar14 = (pEVar19->pLeft->u).zToken;
        goto LAB_0017b1bc;
      }
      pEVar26 = pList->a + lVar25;
      local_d8 = (With *)sqlite3ExprListAppend(pParse,(ExprList *)local_d8,pEVar19);
      if (local_d8 != (With *)0x0) {
        iVar11 = ((ExprList *)local_d8)->nExpr;
        ((ExprList *)local_d8)->a[(long)iVar11 + -1].zName = pEVar26->zName;
        ((ExprList *)local_d8)->a[(long)iVar11 + -1].zSpan = pEVar26->zSpan;
        pEVar26->zName = (char *)0x0;
        pEVar26->zSpan = (char *)0x0;
      }
      pEVar26->pExpr = (Expr *)0x0;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 < pList->nExpr);
LAB_0017b63a:
  exprListDeleteNN(db,pList);
  p->pEList = (ExprList *)local_d8;
LAB_0017b656:
  if (p->pEList == (ExprList *)0x0) {
    return 0;
  }
  if (db->aLimit[2] < p->pEList->nExpr) {
    sqlite3ErrorMsg(pParse,"too many columns in result set");
    return 2;
  }
  if ((uVar34 & 0x200004) != 0) {
    pbVar38 = (byte *)((long)&p->selFlags + 2);
    *pbVar38 = *pbVar38 | 4;
    return 0;
  }
  return 0;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;
  u32 elistFlags = 0;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  assert( p->pSrc!=0 );
  if( (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  sqlite3WithPush(pParse, p->pWith, 0);

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->fg.isRecursive ) continue;
    assert( pFrom->pTab==0 );
#ifndef SQLITE_OMIT_CTE
    if( withExpand(pWalker, pFrom) ) return WRC_Abort;
    if( pFrom->pTab ) {} else
#endif
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      if( sqlite3ExpandSubquery(pParse, pFrom) ) return WRC_Abort;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( IsVirtual(pTab) || pTab->pSelect ){
        i16 nCol;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        nCol = pTab->nCol;
        pTab->nCol = -1;
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
    elistFlags |= pE->flags;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      elistFlags |= pE->flags;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j]) 
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->fg.jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sqlite3TokenInit(&sColname, zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
  if( p->pEList ){
    if( p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
      sqlite3ErrorMsg(pParse, "too many columns in result set");
      return WRC_Abort;
    }
    if( (elistFlags & (EP_HasFunc|EP_Subquery))!=0 ){
      p->selFlags |= SF_ComplexResult;
    }
  }
  return WRC_Continue;
}